

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<unsigned_int>::emplace<unsigned_int&>
          (QPodArrayOps<unsigned_int> *this,qsizetype i,uint *args)

{
  bool bVar1;
  qsizetype qVar2;
  uint *puVar3;
  uint *in_RDX;
  QArrayDataPointer<unsigned_int> *in_RSI;
  long in_RDI;
  uint *where;
  GrowthPosition pos;
  uint tmp;
  bool detach;
  QArrayDataPointer<unsigned_int> *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 uVar4;
  uint uVar5;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 uVar6;
  
  bVar1 = QArrayDataPointer<unsigned_int>::needsDetach(in_stack_ffffffffffffffd0);
  uVar6 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffe4);
  if (!bVar1) {
    if ((in_RSI == *(QArrayDataPointer<unsigned_int> **)(in_RDI + 0x10)) &&
       (qVar2 = QArrayDataPointer<unsigned_int>::freeSpaceAtEnd
                          ((QArrayDataPointer<unsigned_int> *)
                           CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)),
       qVar2 != 0)) {
      puVar3 = QArrayDataPointer<unsigned_int>::end(in_stack_ffffffffffffffd0);
      *puVar3 = *in_RDX;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
      return;
    }
    if ((in_RSI == (QArrayDataPointer<unsigned_int> *)0x0) &&
       (qVar2 = QArrayDataPointer<unsigned_int>::freeSpaceAtBegin
                          ((QArrayDataPointer<unsigned_int> *)
                           CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)),
       qVar2 != 0)) {
      puVar3 = QArrayDataPointer<unsigned_int>::begin((QArrayDataPointer<unsigned_int> *)0x178f2e);
      puVar3[-1] = *in_RDX;
      *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + -4;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
      return;
    }
  }
  uVar5 = *in_RDX;
  uVar4 = 0;
  if ((*(long *)(in_RDI + 0x10) != 0) && (in_RSI == (QArrayDataPointer<unsigned_int> *)0x0)) {
    uVar4 = 1;
  }
  QArrayDataPointer<unsigned_int>::detachAndGrow
            (in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),CONCAT44(uVar6,uVar5),
             (uint **)CONCAT44(uVar4,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0);
  puVar3 = createHole((QPodArrayOps<unsigned_int> *)in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),
                      CONCAT44(uVar6,uVar5),CONCAT44(uVar4,in_stack_ffffffffffffffd8));
  *puVar3 = uVar5;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }